

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_backup * sqlite3_backup_init(sqlite3 *pDestDb,char *zDestDb,sqlite3 *pSrcDb,char *zSrcDb)

{
  int *piVar1;
  int iVar2;
  sqlite3_backup *p;
  Btree *pBVar3;
  char *zFormat;
  
  if (pSrcDb->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(pSrcDb->mutex);
  }
  if (pDestDb->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(pDestDb->mutex);
  }
  if (pSrcDb == pDestDb) {
    zFormat = "source and destination must be distinct";
    iVar2 = 1;
  }
  else {
    p = (sqlite3_backup *)sqlite3MallocZero(0x48);
    if (p != (sqlite3_backup *)0x0) {
      pBVar3 = findBtree(pDestDb,pSrcDb,zSrcDb);
      p->pSrc = pBVar3;
      pBVar3 = findBtree(pDestDb,pDestDb,zDestDb);
      p->pDest = pBVar3;
      p->pDestDb = pDestDb;
      p->pSrcDb = pSrcDb;
      p->iNext = 1;
      p->isAttached = 0;
      if (pBVar3 != (Btree *)0x0 && p->pSrc != (Btree *)0x0) {
        iVar2 = sqlite3BtreeSetPageSize(pBVar3,p->pSrc->pBt->pageSize,-1,0);
        if (iVar2 != 7) {
          piVar1 = &p->pSrc->nBackup;
          *piVar1 = *piVar1 + 1;
          goto LAB_00118776;
        }
      }
      sqlite3_free(p);
      p = (sqlite3_backup *)0x0;
      goto LAB_00118776;
    }
    iVar2 = 7;
    zFormat = (char *)0x0;
  }
  p = (sqlite3_backup *)0x0;
  sqlite3Error(pDestDb,iVar2,zFormat);
LAB_00118776:
  if (pDestDb->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(pDestDb->mutex);
  }
  if (pSrcDb->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(pSrcDb->mutex);
  }
  return p;
}

Assistant:

SQLITE_API sqlite3_backup *sqlite3_backup_init(
  sqlite3* pDestDb,                     /* Database to write to */
  const char *zDestDb,                  /* Name of database within pDestDb */
  sqlite3* pSrcDb,                      /* Database connection to read from */
  const char *zSrcDb                    /* Name of database within pSrcDb */
){
  sqlite3_backup *p;                    /* Value to return */

  /* Lock the source database handle. The destination database
  ** handle is not locked in this routine, but it is locked in
  ** sqlite3_backup_step(). The user is required to ensure that no
  ** other thread accesses the destination handle for the duration
  ** of the backup operation.  Any attempt to use the destination
  ** database connection while a backup is in progress may cause
  ** a malfunction or a deadlock.
  */
  sqlite3_mutex_enter(pSrcDb->mutex);
  sqlite3_mutex_enter(pDestDb->mutex);

  if( pSrcDb==pDestDb ){
    sqlite3Error(
        pDestDb, SQLITE_ERROR, "source and destination must be distinct"
    );
    p = 0;
  }else {
    /* Allocate space for a new sqlite3_backup object...
    ** EVIDENCE-OF: R-64852-21591 The sqlite3_backup object is created by a
    ** call to sqlite3_backup_init() and is destroyed by a call to
    ** sqlite3_backup_finish(). */
    p = (sqlite3_backup *)sqlite3MallocZero(sizeof(sqlite3_backup));
    if( !p ){
      sqlite3Error(pDestDb, SQLITE_NOMEM, 0);
    }
  }

  /* If the allocation succeeded, populate the new object. */
  if( p ){
    p->pSrc = findBtree(pDestDb, pSrcDb, zSrcDb);
    p->pDest = findBtree(pDestDb, pDestDb, zDestDb);
    p->pDestDb = pDestDb;
    p->pSrcDb = pSrcDb;
    p->iNext = 1;
    p->isAttached = 0;

    if( 0==p->pSrc || 0==p->pDest || setDestPgsz(p)==SQLITE_NOMEM ){
      /* One (or both) of the named databases did not exist or an OOM
      ** error was hit.  The error has already been written into the
      ** pDestDb handle.  All that is left to do here is free the
      ** sqlite3_backup structure.
      */
      sqlite3_free(p);
      p = 0;
    }
  }
  if( p ){
    p->pSrc->nBackup++;
  }

  sqlite3_mutex_leave(pDestDb->mutex);
  sqlite3_mutex_leave(pSrcDb->mutex);
  return p;
}